

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Celero.cpp
# Opt level: O3

shared_ptr<celero::Benchmark> __thiscall
celero::RegisterTest
          (celero *this,char *groupName,char *benchmarkName,uint64_t samples,uint64_t iterations,
          uint64_t threads,shared_ptr<celero::Factory> *experimentFactory,double target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Benchmark *this_01;
  Experiment *this_02;
  _Alloc_hider _Var2;
  size_type sVar3;
  string *x;
  TestVector *this_03;
  size_t sVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<celero::Benchmark> sVar5;
  shared_ptr<celero::Experiment> p;
  Experiment *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  string local_a8;
  shared_ptr<celero::Experiment> local_80;
  shared_ptr<celero::Factory> local_70;
  shared_ptr<celero::Benchmark> local_60;
  uint64_t local_50;
  uint64_t local_48;
  double local_40;
  char *local_38;
  
  if (benchmarkName == (char *)0x0 || groupName == (char *)0x0) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_48 = iterations;
    local_40 = target;
    local_38 = groupName;
    x = (string *)TestVector::Instance();
    std::__cxx11::string::string((string *)&local_a8,groupName,(allocator *)&local_b8);
    local_50 = threads;
    TestVector::operator[]((TestVector *)this,x);
    paVar1 = &local_a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)this == 0) {
      local_a8._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<celero::Benchmark,std::allocator<celero::Benchmark>,char_const*&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length,
                 (Benchmark **)&local_a8,(allocator<celero::Benchmark> *)&local_b8,&local_38);
      sVar3 = local_a8._M_string_length;
      _Var2._M_p = local_a8._M_dataplus._M_p;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
      *(pointer *)this = _Var2._M_p;
      *(size_type *)(this + 8) = sVar3;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
        }
      }
      this_03 = TestVector::Instance();
      local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)this;
      local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
      if (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      TestVector::push_back(this_03,&local_60);
      if (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_b8 = (Experiment *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<celero::Experiment,std::allocator<celero::Experiment>,std::shared_ptr<celero::Benchmark>&>
              (&local_b0,&local_b8,(allocator<celero::Experiment> *)&local_a8,
               (shared_ptr<celero::Benchmark> *)this);
    Experiment::setIsBaselineCase(local_b8,false);
    this_02 = local_b8;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(benchmarkName);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,benchmarkName,benchmarkName + sVar4);
    Experiment::setName(this_02,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    Experiment::setSamples(local_b8,samples);
    Experiment::setIterations(local_b8,local_48);
    Experiment::setThreads(local_b8,local_50);
    local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (experimentFactory->super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (experimentFactory->super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    Experiment::setFactory(local_b8,&local_70);
    if (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    Experiment::setBaselineTarget(local_b8,local_40);
    this_01 = *(Benchmark **)this;
    local_80.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8;
    local_80.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_b0._M_pi;
    if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b0._M_pi)->_M_use_count = (local_b0._M_pi)->_M_use_count + 1;
      }
    }
    Benchmark::addExperiment(this_01,&local_80);
    benchmarkName = (char *)extraout_RDX;
    if (local_80.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      benchmarkName = (char *)extraout_RDX_00;
    }
    if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0._M_pi);
      benchmarkName = (char *)extraout_RDX_01;
    }
  }
  sVar5.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)benchmarkName;
  sVar5.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Benchmark>)
         sVar5.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<celero::Benchmark> celero::RegisterTest(const char* groupName, const char* benchmarkName, const uint64_t samples,
														const uint64_t iterations, const uint64_t threads,
														std::shared_ptr<celero::Factory> experimentFactory, const double target)
{
	if(groupName != nullptr && benchmarkName != nullptr)
	{
		auto bm = celero::TestVector::Instance()[groupName];

		if(bm == nullptr)
		{
			bm = std::make_shared<Benchmark>(groupName);
			celero::TestVector::Instance().push_back(bm);
		}

		auto p = std::make_shared<Experiment>(bm);
		p->setIsBaselineCase(false);
		p->setName(benchmarkName);
		p->setSamples(samples);
		p->setIterations(iterations);
		p->setThreads(threads);
		p->setFactory(experimentFactory);
		p->setBaselineTarget(target);

		bm->addExperiment(p);

		return bm;
	}

	return nullptr;
}